

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

bool __thiscall test_case::eval_perf(test_case *this,ggml_backend_t backend,char *op_name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  FILE *pFVar3;
  test_case *ptVar4;
  long *plVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  undefined4 extraout_var;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar13;
  undefined4 extraout_var_03;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  size_t sVar17;
  uint uVar18;
  ulong extraout_RDX;
  char *pcVar19;
  ulong uVar20;
  int i;
  uint uVar21;
  undefined8 in_R8;
  undefined8 in_R9;
  int i_1;
  long lVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ggml_context_ptr ctx;
  ggml_backend_buffer_ptr buf;
  undefined4 uVar30;
  undefined4 uVar31;
  _Head_base<0UL,_ggml_context_*,_false> local_1d8;
  test_case *local_1d0;
  _Head_base<0UL,_ggml_backend_buffer_*,_false> local_1c8;
  long *local_1c0 [2];
  long local_1b0 [2];
  long local_1a0;
  ulong local_198;
  long local_190;
  undefined8 uStack_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [31];
  
  this->mode = MODE_PERF;
  lVar10 = ggml_tensor_overhead();
  local_190 = ggml_graph_overhead_custom(0x2000,0);
  local_190 = local_190 + lVar10 * 0x80;
  uStack_188 = 0;
  local_180 = 1;
  uVar11 = CONCAT71(uStack_17f,1);
  uStack_188._0_4_ = 0;
  uVar30 = (undefined4)local_190;
  uVar31 = (undefined4)uStack_188;
  local_1d8._M_head_impl = (ggml_context *)ggml_init();
  if (local_1d8._M_head_impl == (ggml_context *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-backend-ops.cpp"
               ,0x25f,"GGML_ASSERT(%s) failed","ctx",in_R8,in_R9,uVar30,uVar31,uVar11);
  }
  iVar7 = (*this->_vptr_test_case[4])(this,local_1d8._M_head_impl);
  lVar10 = CONCAT44(extraout_var,iVar7);
  if (op_name == (char *)0x0) {
    bVar24 = false;
  }
  else {
    (*this->_vptr_test_case[2])(local_158,this,lVar10);
    iVar7 = std::__cxx11::string::compare((char *)local_158);
    bVar24 = iVar7 != 0;
    if (local_158[0] != local_148) {
      operator_delete(local_158[0],local_148[0] + 1);
    }
  }
  bVar25 = true;
  if (!bVar24) {
    (*this->_vptr_test_case[2])(local_138,this,lVar10);
    plVar5 = local_138[0];
    (*this->_vptr_test_case[3])(local_1c0,this);
    iVar7 = printf("  %s(%s): ",plVar5,local_1c0[0]);
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0],local_1b0[0] + 1);
    }
    if (local_138[0] != local_128) {
      operator_delete(local_138[0],local_128[0] + 1);
    }
    fflush(_stdout);
    cVar6 = ggml_backend_supports_op(backend,lVar10);
    if (cVar6 == '\0') {
      puts("not supported");
    }
    else {
      uVar18 = iVar7 + 0xe;
      if (-1 < (int)(iVar7 + 7U)) {
        uVar18 = iVar7 + 7U;
      }
      uVar18 = uVar18 & 0xfffffff8;
      uVar21 = uVar18 + 8;
      if (4 < (int)(uVar18 - iVar7)) {
        uVar21 = uVar18;
      }
      printf("%*s",(ulong)(uVar21 - iVar7),"");
      local_1c8._M_head_impl =
           (ggml_backend_buffer *)ggml_backend_alloc_ctx_tensors(local_1d8._M_head_impl,backend);
      if (local_1c8._M_head_impl == (ggml_backend_buffer *)0x0) {
        puts("failed to allocate tensors");
        bVar25 = false;
      }
      else {
        (*this->_vptr_test_case[0xb])(this,local_1d8._M_head_impl);
        uVar11 = ggml_new_graph_custom(local_1d8._M_head_impl,0x2000,0);
        ggml_build_forward_expand(uVar11,lVar10);
        iVar7 = ggml_backend_graph_compute(backend,uVar11);
        pFVar3 = _stderr;
        if (iVar7 == 0) {
          uVar12 = ggml_backend_get_device(backend);
          iVar7 = ggml_backend_dev_type(uVar12);
          iVar8 = (*this->_vptr_test_case[0xd])(this,lVar10);
          local_1d0 = this;
          if (CONCAT44(extraout_var_00,iVar8) == 0) {
            uVar20 = 0x800000000;
            if (iVar7 == 0) {
              uVar20 = 0x200000000;
            }
            iVar7 = ggml_graph_size(uVar11);
            iVar8 = ggml_graph_n_nodes(uVar11);
            iVar9 = (*local_1d0->_vptr_test_case[0xc])(local_1d0,lVar10);
            uVar13 = CONCAT44(extraout_var_02,iVar9);
          }
          else {
            uVar20 = 100000000000;
            if (iVar7 == 0) {
              uVar20 = 8000000000;
            }
            iVar7 = ggml_graph_size(uVar11);
            iVar8 = ggml_graph_n_nodes(uVar11);
            iVar9 = (*local_1d0->_vptr_test_case[0xd])(local_1d0,lVar10);
            uVar13 = CONCAT44(extraout_var_01,iVar9);
          }
          ptVar4 = local_1d0;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar13;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar20;
          uVar20 = uVar20 % uVar13;
          uVar13 = SUB168(auVar2 / auVar1,0) & 0xffffffff;
          if (iVar7 - iVar8 < SUB164(auVar2 / auVar1,0)) {
            uVar13 = (ulong)(uint)(iVar7 - iVar8);
          }
          iVar7 = (int)uVar13;
          if (0 < iVar7) {
            do {
              ggml_graph_add_node(uVar11,lVar10,uVar20);
              uVar18 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar18;
              uVar20 = extraout_RDX;
            } while (uVar18 != 0);
          }
          iVar8 = (*ptVar4->_vptr_test_case[0xc])(ptVar4,lVar10);
          uVar18 = iVar7 + 1;
          local_198 = (ulong)uVar18;
          lVar23 = CONCAT44(extraout_var_03,iVar8) * (long)(int)uVar18;
          for (iVar7 = 0; iVar8 = ggml_graph_n_nodes(uVar11), iVar7 < iVar8; iVar7 = iVar7 + 1) {
            lVar14 = ggml_graph_node(uVar11,iVar7);
            if ((3 < *(int *)(lVar14 + 0x50) - 0x22U) &&
               (lVar14 = ggml_graph_node(uVar11,iVar7), lVar14 != lVar10)) {
              lVar14 = ggml_graph_node(uVar11,iVar7);
              lVar15 = ggml_nbytes(lVar14);
              lVar22 = 0;
              do {
                if (*(long *)(lVar14 + 0x98 + lVar22 * 8) != 0) {
                  lVar16 = ggml_nbytes();
                  lVar15 = lVar15 + lVar16;
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 != 10);
              lVar23 = lVar23 + lVar15;
            }
          }
          lVar14 = 0;
          lVar15 = 0;
          uVar18 = 0;
          local_1a0 = lVar23;
          do {
            lVar23 = ggml_time_us();
            iVar7 = ggml_backend_graph_compute(backend,uVar11);
            pFVar3 = _stderr;
            bVar25 = iVar7 == 0;
            if (!bVar25) {
              uVar11 = ggml_status_to_string(iVar7);
              fprintf(pFVar3,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_perf",
                      uVar11);
              goto LAB_00129fc5;
            }
            lVar22 = ggml_time_us();
            lVar14 = (lVar14 - lVar23) + lVar22;
            lVar15 = lVar15 + local_1a0;
            uVar18 = uVar18 + (int)local_198;
          } while (lVar14 < 1000000);
          dVar27 = (double)lVar14;
          printf("    %8d runs - %8.2f us/run - ",SUB84(dVar27 / (double)(int)uVar18,0),
                 (ulong)uVar18);
          ptVar4 = local_1d0;
          iVar7 = (*local_1d0->_vptr_test_case[0xd])(local_1d0,lVar10);
          if (CONCAT44(extraout_var_04,iVar7) == 0) {
            iVar7 = (*ptVar4->_vptr_test_case[0xc])(ptVar4,lVar10);
            printf("%8zu kB/run - \x1b[1;34m%7.2f GB/s\x1b[0m",
                   SUB84(((double)lVar15 / (dVar27 / 1000000.0)) * 0.0009765625 * 0.0009765625 *
                         0.0009765625,0),CONCAT44(extraout_var_07,iVar7) >> 10);
          }
          else {
            iVar7 = (*ptVar4->_vptr_test_case[0xd])(ptVar4,lVar10);
            iVar8 = (*ptVar4->_vptr_test_case[0xd])(ptVar4,lVar10);
            uVar20 = CONCAT44(extraout_var_06,iVar8);
            auVar28._8_4_ = extraout_var_06;
            auVar28._0_8_ = uVar20;
            auVar28._12_4_ = 0x45300000;
            if (uVar20 >> 0xc < 0xe8d4a51) {
              if (uVar20 < 1000000000) {
                dVar26 = *(double *)(&DAT_001661f0 + (ulong)(uVar20 < 1000000) * 8);
                pcVar19 = "%6.2f MFLOP";
                if (uVar20 < 1000000) {
                  pcVar19 = "%6.2f KFLOP";
                }
              }
              else {
                pcVar19 = "%6.2f GFLOP";
                dVar26 = 1000000000.0;
              }
            }
            else {
              pcVar19 = "%6.2f TFLOP";
              dVar26 = 1000000000000.0;
            }
            snprintf((char *)local_138,0x100,pcVar19,
                     SUB84(((auVar28._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,iVar8) - 4503599627370496.0)) / dVar26,0));
            local_1c0[0] = local_1b0;
            sVar17 = strlen((char *)local_138);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c0,local_138,(long)local_138 + sVar17);
            plVar5 = local_1c0[0];
            lVar10 = CONCAT44(extraout_var_05,iVar7) * (long)(int)uVar18;
            auVar29._8_4_ = (int)((ulong)lVar10 >> 0x20);
            auVar29._0_8_ = lVar10;
            auVar29._12_4_ = 0x45300000;
            dVar26 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                     (dVar27 / 1000000.0);
            dVar27 = 1000000000000.0;
            if (1000000000000.0 <= dVar26) {
              pcVar19 = "%6.2f TFLOP";
            }
            else {
              dVar27 = 1000000000.0;
              if (1000000000.0 <= dVar26) {
                pcVar19 = "%6.2f GFLOP";
              }
              else {
                dVar27 = *(double *)(&DAT_001661f0 + (ulong)(dVar26 < 1000000.0) * 8);
                pcVar19 = "%6.2f MFLOP";
                if (dVar26 < 1000000.0) {
                  pcVar19 = "%6.2f KFLOP";
                }
              }
            }
            snprintf((char *)local_138,0x100,pcVar19,SUB84(dVar26 / dVar27,0));
            local_178[0] = local_168;
            sVar17 = strlen((char *)local_138);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_178,local_138,(long)local_138 + sVar17);
            printf("%s/run - \x1b[1;34m%sS\x1b[0m",plVar5,local_178[0]);
            if (local_178[0] != local_168) {
              operator_delete(local_178[0],local_168[0] + 1);
            }
            if (local_1c0[0] != local_1b0) {
              operator_delete(local_1c0[0],local_1b0[0] + 1);
            }
          }
          putchar(10);
        }
        else {
          uVar11 = ggml_status_to_string(iVar7);
          bVar25 = false;
          fprintf(pFVar3,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_perf",uVar11);
        }
      }
LAB_00129fc5:
      std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
                ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&local_1c8);
    }
  }
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)&local_1d8);
  return bVar25;
}

Assistant:

bool eval_perf(ggml_backend_t backend, const char * op_name) {
        mode = MODE_PERF;

        static const size_t graph_nodes = 8192;

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + ggml_graph_overhead_custom(graph_nodes, false),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context_ptr ctx(ggml_init(params)); // smart ptr
        GGML_ASSERT(ctx);

        ggml_tensor * out = build_graph(ctx.get());

        if (op_name != nullptr && op_desc(out) != op_name) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            return true;
        }

        int len = printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        // check if backends support op
        if (!ggml_backend_supports_op(backend, out)) {
            printf("not supported\n");
            return true;
        }

        // align while also leaving some margin for variations in parameters
        int align = 8;
        int last = (len + align - 1) / align * align;
        if (last - len < 5) {
            last += align;
        }
        printf("%*s", last - len, "");

        // allocate
        ggml_backend_buffer_ptr buf(ggml_backend_alloc_ctx_tensors(ctx.get(), backend)); // smart ptr

        if (buf == NULL) {
            printf("failed to allocate tensors\n");
            return false;
        }

        // randomize tensors
        initialize_tensors(ctx.get());

        // build graph
        ggml_cgraph * gf = ggml_new_graph_custom(ctx.get(), graph_nodes, false);
        ggml_build_forward_expand(gf, out);

        // warmup run
        ggml_status status = ggml_backend_graph_compute(backend, gf);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }

        // determine number of runs
        int n_runs;
        bool is_cpu = ggml_backend_dev_type(ggml_backend_get_device(backend)) == GGML_BACKEND_DEVICE_TYPE_CPU;
        if (op_flops(out) > 0) {
            // based on flops
            const uint64_t GFLOP = 1000 * 1000 * 1000;
            const uint64_t target_flops_cpu =   8ULL * GFLOP;
            const uint64_t target_flops_gpu = 100ULL * GFLOP;
            uint64_t target_flops = is_cpu ? target_flops_cpu : target_flops_gpu;
            n_runs = std::min<int>(ggml_graph_size(gf) - ggml_graph_n_nodes(gf), target_flops / op_flops(out)) + 1;
        } else {
            // based on memory size
            const size_t GB = 1ULL << 30;
            const size_t target_size_cpu =  8 * GB;
            const size_t target_size_gpu = 32 * GB;
            size_t target_size = is_cpu ? target_size_cpu : target_size_gpu;
            n_runs = std::min<int>(ggml_graph_size(gf) - ggml_graph_n_nodes(gf), target_size / op_size(out)) + 1;
        }

        // duplicate the op
        for (int i = 1; i < n_runs; i++) {
            ggml_graph_add_node(gf, out);
        }

        // calculate memory
        size_t mem = n_runs * op_size(out);
        auto tensor_op_size = [](ggml_tensor * t) {
            size_t size = ggml_nbytes(t);
            // add source tensors
            for (int i = 0; i < GGML_MAX_SRC; i++) {
                if (t->src[i] != NULL) {
                    size += ggml_nbytes(t->src[i]);
                }
            }
            return size;
        };
        for (int i = 0; i < ggml_graph_n_nodes(gf); ++i) {
            if (ggml_is_view_op(ggml_graph_node(gf, i)->op) || ggml_graph_node(gf, i) == out) {
                continue;
            }
            mem += tensor_op_size(ggml_graph_node(gf, i));
        }

        // run
        int64_t total_time_us = 0;
        int64_t total_mem = 0;
        int total_runs = 0;
        do {
            int64_t start_time = ggml_time_us();
            ggml_status status = ggml_backend_graph_compute(backend, gf);
            if (status != GGML_STATUS_SUCCESS) {
                fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                return false;
            }
            int64_t end_time = ggml_time_us();

            total_time_us += end_time - start_time;
            total_mem += mem;
            total_runs += n_runs;
        } while (total_time_us < 1000*1000); // run for at least 1 second

        printf("    %8d runs - %8.2f us/run - ",
            total_runs,
            (double)total_time_us / total_runs);

        if (op_flops(out) > 0) {
            double flops_per_sec = (op_flops(out) * total_runs) / (total_time_us / 1e6);
            auto format_flops = [](double flops) -> std::string {
                char buf[256];
                if (flops >= 1e12) {
                    snprintf(buf, sizeof(buf), "%6.2f TFLOP", flops / 1e12);
                } else if (flops >= 1e9) {
                    snprintf(buf, sizeof(buf), "%6.2f GFLOP", flops / 1e9);
                } else if (flops >= 1e6) {
                    snprintf(buf, sizeof(buf), "%6.2f MFLOP", flops / 1e6);
                } else {
                    snprintf(buf, sizeof(buf), "%6.2f KFLOP", flops / 1e3);
                }
                return buf;
            };
            printf("%s/run - \033[1;34m%sS\033[0m",
                format_flops(op_flops(out)).c_str(),
                format_flops(flops_per_sec).c_str());

        } else {
            printf("%8zu kB/run - \033[1;34m%7.2f GB/s\033[0m",
                op_size(out) / 1024,
                total_mem / (total_time_us / 1e6) / 1024.0 / 1024.0 / 1024.0);
        }
        printf("\n");

        return true;
    }